

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libregexp.c
# Opt level: O0

int re_is_simple_quantifier(uint8_t *bc_buf,int bc_buf_len)

{
  uint32_t uVar1;
  int in_ESI;
  long in_RDI;
  uint32_t val;
  int count;
  int len;
  int opcode;
  int pos;
  int local_24;
  uint local_20;
  int local_18;
  
  local_24 = 0;
  local_18 = 0;
  do {
    if (in_ESI <= local_18) {
      return local_24;
    }
    local_20 = (uint)reopcode_info[(int)(uint)*(byte *)(in_RDI + local_18)].size;
    switch((uint)*(byte *)(in_RDI + local_18)) {
    case 1:
    case 2:
    case 3:
    case 4:
      break;
    case 5:
    case 6:
    case 0x11:
    case 0x12:
      goto LAB_001cd4d9;
    default:
      return -1;
    case 0x15:
      uVar1 = get_u16((uint8_t *)(in_RDI + local_18 + 1));
      local_20 = uVar1 * 4 + local_20;
      break;
    case 0x16:
      uVar1 = get_u16((uint8_t *)(in_RDI + local_18 + 1));
      local_20 = uVar1 * 8 + local_20;
    }
    local_24 = local_24 + 1;
LAB_001cd4d9:
    local_18 = local_20 + local_18;
  } while( true );
}

Assistant:

static int re_is_simple_quantifier(const uint8_t *bc_buf, int bc_buf_len)
{
    int pos, opcode, len, count;
    uint32_t val;
    
    count = 0;
    pos = 0;
    while (pos < bc_buf_len) {
        opcode = bc_buf[pos];
        len = reopcode_info[opcode].size;
        switch(opcode) {
        case REOP_range:
            val = get_u16(bc_buf + pos + 1);
            len += val * 4;
            goto simple_char;
        case REOP_range32:
            val = get_u16(bc_buf + pos + 1);
            len += val * 8;
            goto simple_char;
        case REOP_char:
        case REOP_char32:
        case REOP_dot:
        case REOP_any:
        simple_char:
            count++;
            break;
        case REOP_line_start:
        case REOP_line_end:
        case REOP_word_boundary:
        case REOP_not_word_boundary:
            break;
        default:
            return -1;
        }
        pos += len;
    }
    return count;
}